

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

void __thiscall soplex::SoPlexBase<double>::_syncLPReal(SoPlexBase<double> *this,bool time)

{
  undefined7 in_register_00000031;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *old;
  
  old = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
         *)&stack0xfffffffffffffe18;
  if ((int)CONCAT71(in_register_00000031,time) != 0) {
    (*this->_statistics->syncTime->_vptr_Timer[3])();
  }
  if (this->_isRealLPLoaded == true) {
    SPxLPBase<double>::
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
              ((SPxLPBase<double> *)&stack0xfffffffffffffe18,this->_rationalLP);
    SPxSolverBase<double>::loadLP(&this->_solver,(SPxLPBase<double> *)&stack0xfffffffffffffe18,true)
    ;
    SPxLPBase<double>::~SPxLPBase((SPxLPBase<double> *)&stack0xfffffffffffffe18);
  }
  else {
    old = this->_rationalLP;
    SPxLPBase<double>::operator=(this->_realLP,old);
  }
  this->_hasBasis = false;
  if ((this->_rationalLUSolver).super_CLUFactorRational.stat != UNLOADED) {
    SLUFactorRational::init(&this->_rationalLUSolver,(EVP_PKEY_CTX *)old);
  }
  if (time) {
    (*this->_statistics->syncTime->_vptr_Timer[4])();
  }
  return;
}

Assistant:

void SoPlexBase<R>::_syncLPReal(bool time)
{
   // start timing
   if(time)
      _statistics->syncTime->start();

   // copy LP
   if(_isRealLPLoaded)
      _solver.loadLP((SPxLPBase<R>)(*_rationalLP));
   else
      *_realLP = *_rationalLP;

   ///@todo try loading old basis
   _hasBasis = false;
   _rationalLUSolver.clear();

   // stop timing
   if(time)
      _statistics->syncTime->stop();
}